

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O1

int ztlex_sgetc(ztlex_t *lex)

{
  size_t sVar1;
  int iVar2;
  
  sVar1 = lex->index;
  iVar2 = -1;
  if (sVar1 != lex->length) {
    lex->index = sVar1 + 1;
    iVar2 = (int)lex->string[sVar1];
    if (iVar2 == 10) {
      lex->line = lex->line + 1;
      lex->prevcolumn = lex->column;
      lex->column = 1;
      return 10;
    }
    lex->column = lex->column + 1;
  }
  return iVar2;
}

Assistant:

static int ztlex_sgetc(ztlex_t *lex)
{
  int c;

  assert(lex->string);
  assert(lex->index <= lex->length);

  if (lex->index == lex->length)
    return EOF;

  c = lex->string[lex->index++];
  if (c == '\n')
  {
    lex->line++;
    lex->prevcolumn = lex->column;
    lex->column = 1;
  }
  else
  {
    lex->column++;
  }

  return c;
}